

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_pop_stack(Integer memhandle)

{
  Boolean BVar1;
  AD *pAVar2;
  AD *in_RDI;
  AD *ad;
  char *in_stack_00000020;
  BlockLocation in_stack_0000002c;
  AD **in_stack_00000030;
  Integer in_stack_00000038;
  AD *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff8;
  
  ma_stats.calls[0x14] = ma_stats.calls[0x14] + 1;
  BVar1 = mh2ad(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  if (BVar1 == 0) {
    BVar1 = 0;
  }
  else {
    if (ma_trace != 0) {
      printf("MA: popping \'%s\'\n",in_stack_ffffffffffffffe8->name);
    }
    pAVar2 = list_delete(in_RDI,(AD **)in_stack_ffffffffffffffe8);
    if (pAVar2 == in_stack_ffffffffffffffe8) {
      ma_sp = ma_sp + in_stack_ffffffffffffffe8->nbytes;
      ma_stats.sblocks = ma_stats.sblocks - 1;
      ma_stats.sbytes = ma_stats.sbytes - in_stack_ffffffffffffffe8->nbytes;
      ma_table_deallocate(0x1b6ce0);
      BVar1 = 1;
    }
    else {
      sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not on stack used list",in_RDI,
              in_stack_ffffffffffffffe8->name);
      ma_error(ad._4_4_,(ErrorType)ad,in_stack_fffffffffffffff8,(char *)in_RDI);
      BVar1 = 0;
    }
  }
  return BVar1;
}

Assistant:

public Boolean MA_pop_stack(Integer memhandle) /* the block to deallocate */
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_pop_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_StackTop, "MA_pop_stack"))
        return MA_FALSE;

    if (ma_trace) 
    (void)printf("MA: popping '%s'\n", ad->name);

    /* delete block from used list */
    if (list_delete(ad, &ma_sused) != ad)
    {
        (void)sprintf(ma_ebuf,
            "memhandle %ld (name: '%s') not on stack used list",
            (size_t)memhandle, ad->name);
        ma_error(EL_Nonfatal, ET_Internal, "MA_pop_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* pop block from stack */
    ma_sp += ad->nbytes;

#ifdef STATS
    ma_stats.sblocks--;
    ma_stats.sbytes -= ad->nbytes;
#endif /* STATS */

    /* free memhandle */
    ma_table_deallocate(memhandle);

    /* success */
    return MA_TRUE;
}